

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::PhysicalNestedLoopJoin::ExecuteInternal
          (PhysicalNestedLoopJoin *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          GlobalOperatorState *gstate_p,OperatorState *state_p)

{
  JoinType join_type;
  OperatorResultType OVar1;
  pointer pGVar2;
  NotImplementedException *this_00;
  JoinType type;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  join_type = (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
              field_0x81;
  if (*(long *)&pGVar2[1].state == 0) {
    if (((byte)(join_type - 2) < 9) && ((0x18bU >> (join_type - 2 & 0x1f) & 1) != 0)) {
      return FINISHED;
    }
    PhysicalComparisonJoin::ConstructEmptyJoinResult
              (join_type,(bool)(*(byte *)&pGVar2[4]._vptr_GlobalSinkState & 1),input,chunk);
  }
  else {
    if (join_type - 1 < 4) {
      OVar1 = ResolveComplexJoin(this,context,input,chunk,state_p);
      return OVar1;
    }
    if (2 < join_type - 5) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      JoinTypeToString_abi_cxx11_
                (&sStack_88,
                 (duckdb *)
                 (ulong)(byte)(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                              super_CachingPhysicalOperator.field_0x81,type);
      ::std::operator+(&local_68,"Unimplemented type ",&sStack_88);
      ::std::operator+(&local_48,&local_68," for nested loop join!");
      NotImplementedException::NotImplementedException(this_00,(string *)&local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ResolveSimpleJoin(this,context,input,chunk,state_p);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalNestedLoopJoin::ExecuteInternal(ExecutionContext &context, DataChunk &input,
                                                           DataChunk &chunk, GlobalOperatorState &gstate_p,
                                                           OperatorState &state_p) const {
	auto &gstate = sink_state->Cast<NestedLoopJoinGlobalState>();

	if (gstate.right_payload_data.Count() == 0) {
		// empty RHS
		if (!EmptyResultIfRHSIsEmpty()) {
			ConstructEmptyJoinResult(join_type, gstate.has_null, input, chunk);
			return OperatorResultType::NEED_MORE_INPUT;
		} else {
			return OperatorResultType::FINISHED;
		}
	}

	switch (join_type) {
	case JoinType::SEMI:
	case JoinType::ANTI:
	case JoinType::MARK:
		// simple joins can have max STANDARD_VECTOR_SIZE matches per chunk
		ResolveSimpleJoin(context, input, chunk, state_p);
		return OperatorResultType::NEED_MORE_INPUT;
	case JoinType::LEFT:
	case JoinType::INNER:
	case JoinType::OUTER:
	case JoinType::RIGHT:
		return ResolveComplexJoin(context, input, chunk, state_p);
	default:
		throw NotImplementedException("Unimplemented type " + JoinTypeToString(join_type) + " for nested loop join!");
	}
}